

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O2

QSizeF __thiscall QItemDelegatePrivate::doTextLayout(QItemDelegatePrivate *this,int lineWidth)

{
  undefined4 uVar1;
  qreal extraout_RDX;
  long in_FS_OFFSET;
  double dVar2;
  QSizeF QVar3;
  double local_60;
  double local_58;
  QPointF local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QTextLayout::beginLayout();
  local_58 = 0.0;
  local_60 = 0.0;
  dVar2 = local_58;
  while( true ) {
    local_58 = dVar2;
    local_38.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    local_38.yp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    uVar1 = QTextLayout::createLine();
    local_38.xp = (qreal)CONCAT44(local_38.xp._4_4_,uVar1);
    local_38.yp = extraout_RDX;
    if (extraout_RDX == 0.0) break;
    QTextLine::setLineWidth((double)lineWidth);
    QTextLine::setPosition(&local_38);
    dVar2 = (double)QTextLine::height();
    local_60 = local_60 + dVar2;
    dVar2 = (double)QTextLine::naturalTextWidth();
    if (dVar2 <= local_58) {
      dVar2 = local_58;
    }
  }
  QTextLayout::endLayout();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  QVar3.ht = local_60;
  QVar3.wd = local_58;
  return QVar3;
}

Assistant:

QSizeF QItemDelegatePrivate::doTextLayout(int lineWidth) const
{
    qreal height = 0;
    qreal widthUsed = 0;
    textLayout.beginLayout();
    while (true) {
        QTextLine line = textLayout.createLine();
        if (!line.isValid())
            break;
        line.setLineWidth(lineWidth);
        line.setPosition(QPointF(0, height));
        height += line.height();
        widthUsed = qMax(widthUsed, line.naturalTextWidth());
    }
    textLayout.endLayout();
    return QSizeF(widthUsed, height);
}